

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

int __thiscall duckdb_re2::ByteMapBuilder::Recolor(ByteMapBuilder *this,int oldcolor)

{
  pointer ppVar1;
  pointer ppVar2;
  long lVar3;
  pointer ppVar4;
  long lVar5;
  int newcolor;
  int local_10;
  int local_c;
  
  ppVar2 = (this->colormap_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar1 = (this->colormap_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)ppVar1 - (long)ppVar2;
  ppVar2 = ppVar2 + 2;
  for (lVar3 = lVar5 >> 5; 0 < lVar3; lVar3 = lVar3 + -1) {
    if ((ppVar2[-2].first == oldcolor) || (ppVar2[-2].second == oldcolor)) {
      ppVar4 = ppVar2 + -2;
      goto LAB_0041bb32;
    }
    if ((ppVar2[-1].first == oldcolor) || (ppVar2[-1].second == oldcolor)) {
      ppVar4 = ppVar2 + -1;
      goto LAB_0041bb32;
    }
    ppVar4 = ppVar2;
    if ((ppVar2->first == oldcolor) || (ppVar2->second == oldcolor)) goto LAB_0041bb32;
    if ((ppVar2[1].first == oldcolor) || (ppVar2[1].second == oldcolor)) {
      ppVar4 = ppVar2 + 1;
      goto LAB_0041bb32;
    }
    ppVar2 = ppVar2 + 4;
    lVar5 = lVar5 + -0x20;
  }
  lVar5 = lVar5 >> 3;
  ppVar4 = ppVar2 + -2;
  if (lVar5 == 1) {
LAB_0041bb87:
    ppVar2 = ppVar1;
    if (ppVar4->second == oldcolor) {
      ppVar2 = ppVar4;
    }
    if (ppVar4->first != oldcolor) {
      ppVar4 = ppVar2;
    }
  }
  else if (lVar5 == 3) {
    if ((ppVar2[-2].first != oldcolor) && (ppVar2[-2].second != oldcolor)) {
      ppVar4 = ppVar2 + -1;
      goto LAB_0041bb78;
    }
  }
  else {
    if (lVar5 != 2) goto LAB_0041bb3d;
LAB_0041bb78:
    if ((ppVar4->first != oldcolor) && (ppVar4->second != oldcolor)) {
      ppVar4 = ppVar4 + 1;
      goto LAB_0041bb87;
    }
  }
LAB_0041bb32:
  if (ppVar4 != ppVar1) {
    return ppVar4->second;
  }
LAB_0041bb3d:
  local_c = this->nextcolor_;
  this->nextcolor_ = local_c + 1;
  local_10 = oldcolor;
  std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
            ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->colormap_,
             &local_10,&local_c);
  return local_c;
}

Assistant:

int ByteMapBuilder::Recolor(int oldcolor) {
  // Yes, this is a linear search. There can be at most 256
  // colors and there will typically be far fewer than that.
  // Also, we need to consider keys *and* values in order to
  // avoid recoloring a given range more than once per batch.
  std::vector<std::pair<int, int>>::const_iterator it =
      std::find_if(colormap_.begin(), colormap_.end(),
                   [=](const std::pair<int, int>& kv) -> bool {
                     return kv.first == oldcolor || kv.second == oldcolor;
                   });
  if (it != colormap_.end())
    return it->second;
  int newcolor = nextcolor_;
  nextcolor_++;
  colormap_.emplace_back(oldcolor, newcolor);
  return newcolor;
}